

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_eval.cc
# Opt level: O2

base_learner * explore_eval_setup(options_i *options,vw *all)

{
  int iVar1;
  option_group_definition *this;
  base_learner *l;
  multi_learner *base;
  learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar2;
  long lVar3;
  undefined **ppuVar4;
  label_parser *plVar5;
  byte bVar6;
  bool explore_eval_option;
  allocator local_38c;
  allocator local_38b;
  allocator local_38a;
  allocator local_389;
  free_ptr<EXPLORE_EVAL::explore_eval> data;
  string local_378 [32];
  string local_358 [32];
  string local_338;
  string local_318;
  string local_2f8;
  undefined1 local_2d8 [112];
  bool local_268;
  option_group_definition new_options;
  undefined1 local_200 [160];
  typed_option<float> local_160;
  typed_option<bool> local_c0;
  
  bVar6 = 0;
  scoped_calloc_or_throw<EXPLORE_EVAL::explore_eval>();
  explore_eval_option = false;
  std::__cxx11::string::string((string *)&local_2f8,"Explore evaluation",(allocator *)local_2d8);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::string((string *)&local_318,"explore_eval",&local_389);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2d8,&local_318,&explore_eval_option);
  local_268 = true;
  std::__cxx11::string::string(local_358,"Evaluate explore_eval adf policies",&local_38a);
  std::__cxx11::string::_M_assign((string *)(local_2d8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_c0,(typed_option<bool> *)local_2d8);
  this = VW::config::option_group_definition::add<bool>(&new_options,&local_c0);
  std::__cxx11::string::string((string *)&local_338,"multiplier",&local_38b);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_200,&local_338,
             &(data._M_t.super___uniq_ptr_impl<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_EXPLORE_EVAL::explore_eval_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_EXPLORE_EVAL::explore_eval_*,_false>._M_head_impl)->multiplier)
  ;
  std::__cxx11::string::string
            (local_378,"Multiplier used to make all rejection sample probabilities <= 1",&local_38c)
  ;
  std::__cxx11::string::_M_assign((string *)(local_200 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_160,(typed_option<float> *)local_200);
  VW::config::option_group_definition::add<float>(this,&local_160);
  VW::config::typed_option<float>::~typed_option(&local_160);
  std::__cxx11::string::~string(local_378);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_200);
  std::__cxx11::string::~string((string *)&local_338);
  VW::config::typed_option<bool>::~typed_option(&local_c0);
  std::__cxx11::string::~string(local_358);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_2d8);
  std::__cxx11::string::~string((string *)&local_318);
  (**options->_vptr_options_i)(options,&new_options);
  if (explore_eval_option == false) {
    plVar2 = (learner<EXPLORE_EVAL::explore_eval,_std::vector<example_*,_std::allocator<example_*>_>_>
              *)0x0;
  }
  else {
    (data._M_t.super___uniq_ptr_impl<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_EXPLORE_EVAL::explore_eval_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_EXPLORE_EVAL::explore_eval_*,_false>._M_head_impl)->all = all;
    std::__cxx11::string::string((string *)local_2d8,"multiplier",(allocator *)local_200);
    iVar1 = (*options->_vptr_options_i[1])(options,local_2d8);
    std::__cxx11::string::~string((string *)local_2d8);
    if ((char)iVar1 == '\0') {
      (data._M_t.super___uniq_ptr_impl<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_EXPLORE_EVAL::explore_eval_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_EXPLORE_EVAL::explore_eval_*,_false>._M_head_impl)->multiplier = 1.0;
    }
    else {
      (data._M_t.super___uniq_ptr_impl<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_EXPLORE_EVAL::explore_eval_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_EXPLORE_EVAL::explore_eval_*,_false>._M_head_impl)->fixed_multiplier =
           true;
    }
    std::__cxx11::string::string((string *)local_2d8,"cb_explore_adf",(allocator *)local_200);
    iVar1 = (*options->_vptr_options_i[1])(options,local_2d8);
    std::__cxx11::string::~string((string *)local_2d8);
    if ((char)iVar1 == '\0') {
      std::__cxx11::string::string((string *)local_2d8,"cb_explore_adf",(allocator *)local_358);
      std::__cxx11::string::string((string *)local_200,"",(allocator *)local_378);
      (*options->_vptr_options_i[5])(options,local_2d8,local_200);
      std::__cxx11::string::~string((string *)local_200);
      std::__cxx11::string::~string((string *)local_2d8);
    }
    all->delete_prediction = (_func_void_void_ptr *)0x0;
    l = setup_base(options,all);
    base = LEARNER::as_multiline<char,char>(l);
    ppuVar4 = &CB::cb_label;
    plVar5 = &all->p->lp;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      plVar5->default_label = (_func_void_void_ptr *)*ppuVar4;
      ppuVar4 = ppuVar4 + (ulong)bVar6 * -2 + 1;
      plVar5 = (label_parser *)((long)plVar5 + (ulong)bVar6 * -0x10 + 8);
    }
    all->label_type = cb;
    plVar2 = LEARNER::
             learner<EXPLORE_EVAL::explore_eval,std::vector<example*,std::allocator<example*>>>::
             init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                       (data._M_t.
                        super___uniq_ptr_impl<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_EXPLORE_EVAL::explore_eval_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_EXPLORE_EVAL::explore_eval_*,_false>._M_head_impl,base
                        ,EXPLORE_EVAL::do_actual_learning<true>,
                        EXPLORE_EVAL::do_actual_learning<false>,1,action_probs);
    data._M_t.super___uniq_ptr_impl<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_EXPLORE_EVAL::explore_eval_*,_void_(*)(void_*)>.
    super__Head_base<0UL,_EXPLORE_EVAL::explore_eval_*,_false>._M_head_impl = (explore_eval *)0x0;
    *(undefined8 *)(plVar2 + 0x58) = *(undefined8 *)(plVar2 + 0x18);
    *(code **)(plVar2 + 0x68) = EXPLORE_EVAL::finish_multiline_example;
    *(undefined8 *)(plVar2 + 0xb8) = *(undefined8 *)(plVar2 + 0x18);
    *(undefined8 *)(plVar2 + 0xc0) = *(undefined8 *)(plVar2 + 0x20);
    *(code **)(plVar2 + 200) = EXPLORE_EVAL::finish;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<EXPLORE_EVAL::explore_eval,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar2;
}

Assistant:

base_learner* explore_eval_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<explore_eval>();
  bool explore_eval_option = false;
  option_group_definition new_options("Explore evaluation");
  new_options.add(make_option("explore_eval", explore_eval_option).keep().help("Evaluate explore_eval adf policies"))
      .add(make_option("multiplier", data->multiplier)
               .help("Multiplier used to make all rejection sample probabilities <= 1"));
  options.add_and_parse(new_options);

  if (!explore_eval_option)
    return nullptr;

  data->all = &all;

  if (options.was_supplied("multiplier"))
    data->fixed_multiplier = true;
  else
    data->multiplier = 1;

  if (!options.was_supplied("cb_explore_adf"))
    options.insert("cb_explore_adf", "");

  all.delete_prediction = nullptr;

  multi_learner* base = as_multiline(setup_base(options, all));
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  learner<explore_eval, multi_ex>& l =
      init_learner(data, base, do_actual_learning<true>, do_actual_learning<false>, 1, prediction_type::action_probs);

  l.set_finish_example(finish_multiline_example);
  l.set_finish(finish);
  return make_base(l);
}